

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O1

void cea708_dump(cea708_t *cea708)

{
  uint uVar1;
  cc_data_t cVar2;
  char *pcVar3;
  ulong uVar4;
  
  fprintf(_stderr,"itu_t_t35_country_code_t %d\n",(ulong)cea708->country);
  fprintf(_stderr,"itu_t_t35_provider_code_t %d\n",(ulong)cea708->provider);
  uVar1 = cea708->user_identifier;
  fprintf(_stderr,"user_identifier %c%c%c%c\n",(ulong)(uVar1 >> 0x18),(ulong)(uVar1 >> 0x10 & 0xff),
          (ulong)(uVar1 >> 8 & 0xff),(ulong)(uVar1 & 0xff));
  fprintf(_stderr,"user_data_type_code %d\n",(ulong)cea708->user_data_type_code);
  fprintf(_stderr,"directv_user_data_length %d\n",(ulong)cea708->directv_user_data_length);
  fprintf(_stderr,"user_data.process_em_data_flag %d\n",(ulong)(*(ushort *)&cea708->user_data & 1));
  fprintf(_stderr,"user_data.process_cc_data_flag %d\n",
          (ulong)(*(uint *)&cea708->user_data >> 1 & 1));
  fprintf(_stderr,"user_data.additional_data_flag %d\n",
          (ulong)(*(uint *)&cea708->user_data >> 2 & 1));
  fprintf(_stderr,"user_data.cc_count %d\n",(ulong)(*(uint *)&cea708->user_data >> 3 & 0x1f));
  fprintf(_stderr,"user_data.em_data %d\n",(ulong)(byte)(cea708->user_data).field_0x1);
  if ((undefined1  [132])((undefined1  [132])cea708->user_data & (undefined1  [132])0xf8) !=
      (undefined1  [132])0x0) {
    uVar4 = 0;
    do {
      cVar2 = (cea708->user_data).cc_data[uVar4];
      if (((uint)cVar2 & 0xe0) == 0x20) {
        eia608_dump(cVar2._1_2_);
      }
      else {
        cVar2 = (cea708->user_data).cc_data[uVar4];
        pcVar3 = "true";
        if (((uint)cVar2 & 0x20) == 0) {
          pcVar3 = "false";
        }
        fprintf(_stderr,"user_data.cc_data[%d] cc_valid: %s, cc_type: %d, cc_data: %04x\n",
                uVar4 & 0xffffffff,pcVar3,(ulong)((uint)cVar2 >> 6 & 3),
                (ulong)((uint)cVar2 >> 8 & 0xffff));
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (*(ushort *)&cea708->user_data >> 3 & 0x1f));
  }
  return;
}

Assistant:

void cea708_dump(cea708_t* cea708)
{
    int i;

    fprintf(stderr, "itu_t_t35_country_code_t %d\n", cea708->country);
    fprintf(stderr, "itu_t_t35_provider_code_t %d\n", cea708->provider);
    fprintf(stderr, "user_identifier %c%c%c%c\n",
        (cea708->user_identifier >> 24) & 0xFF, (cea708->user_identifier >> 16) & 0xFF,
        (cea708->user_identifier >> 8) & 0xFF, cea708->user_identifier & 0xFF);
    fprintf(stderr, "user_data_type_code %d\n", cea708->user_data_type_code);
    fprintf(stderr, "directv_user_data_length %d\n", cea708->directv_user_data_length);
    fprintf(stderr, "user_data.process_em_data_flag %d\n", cea708->user_data.process_em_data_flag);
    fprintf(stderr, "user_data.process_cc_data_flag %d\n", cea708->user_data.process_cc_data_flag);
    fprintf(stderr, "user_data.additional_data_flag %d\n", cea708->user_data.additional_data_flag);
    fprintf(stderr, "user_data.cc_count %d\n", cea708->user_data.cc_count);
    fprintf(stderr, "user_data.em_data %d\n", cea708->user_data.em_data);

    for (i = 0; i < (int)cea708->user_data.cc_count; ++i) {
        int valid;
        cea708_cc_type_t type;
        uint16_t cc_data = cea708_cc_data(&cea708->user_data, i, &valid, &type);

        if (valid && cc_type_ntsc_cc_field_1 == type) {
            eia608_dump(cc_data);
        } else {
            fprintf(stderr, "user_data.cc_data[%d] cc_valid: %s, cc_type: %d, cc_data: %04x\n", i, cea708->user_data.cc_data[i].cc_valid ? "true" : "false", cea708->user_data.cc_data[i].cc_type, cea708->user_data.cc_data[i].cc_data);
        }
    }
}